

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_int64(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
           int64_t val,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  binary_stream_sink *pbVar2;
  pointer psVar3;
  ldiv_t lVar4;
  int iVar5;
  undefined7 in_register_00000011;
  ldiv_t lVar7;
  ldiv_t lVar8;
  long lVar6;
  
  iVar5 = (int)CONCAT71(in_register_00000011,tag);
  if (iVar5 == 7) {
    if (val == 0) {
LAB_0043ad5f:
      val = 0;
      goto LAB_0043ad64;
    }
    lVar8 = ldiv(val,1000000000);
    lVar7.rem = -lVar8.rem;
    lVar7.quot = lVar8.quot;
    if (lVar8.rem < 1) {
      lVar8 = lVar7;
    }
  }
  else if (iVar5 == 6) {
    if (val == 0) goto LAB_0043ad5f;
    lVar7 = ldiv(val,1000);
    lVar6 = lVar7.rem;
    lVar4.rem = lVar6 * 1000000;
    lVar4.quot = lVar7.quot;
    lVar8.rem = lVar6 * -1000000;
    lVar8.quot = lVar7.quot;
    if (-1 < lVar6) {
      lVar8 = lVar4;
    }
  }
  else {
    if (iVar5 != 5) {
      if (val < 0) {
        if ((ulong)val < 0xffffffffffffffe0) {
          pbVar2 = &this->sink_;
          if ((ulong)val < 0xffffffffffffff80) {
            if ((ulong)val < 0xffffffffffff8000) {
              if ((ulong)val < 0xffffffff80000000) {
                binary_stream_sink::push_back(pbVar2,0xd3);
                binary::
                native_to_big<long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                          (val,(back_insert_iterator<jsoncons::binary_stream_sink>)pbVar2);
              }
              else {
                binary_stream_sink::push_back(pbVar2,0xd2);
                binary::
                native_to_big<int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                          ((uint)val,(back_insert_iterator<jsoncons::binary_stream_sink>)pbVar2);
              }
            }
            else {
              binary_stream_sink::push_back(pbVar2,0xd1);
              binary::
              native_to_big<short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                        ((unsigned_short)val,
                         (back_insert_iterator<jsoncons::binary_stream_sink>)pbVar2);
            }
            goto LAB_0043ad6b;
          }
          binary_stream_sink::push_back(pbVar2,0xd0);
        }
        binary::
        native_to_big<signed_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  ((uint8_t)val,(back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
      }
      else {
        if (0x7f < (ulong)val) {
          if (0xff < (ulong)val) {
            if ((ulong)val < 0x10000) {
              binary_stream_sink::push_back(&this->sink_,0xcd);
              binary::
              native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                        ((unsigned_short)val,
                         (back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
            }
            else {
              pbVar2 = &this->sink_;
              if ((ulong)val >> 0x20 == 0) {
                binary_stream_sink::push_back(pbVar2,0xce);
                binary::
                native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                          ((uint)val,(back_insert_iterator<jsoncons::binary_stream_sink>)pbVar2);
              }
              else {
                binary_stream_sink::push_back(pbVar2,0xcf);
                binary::
                native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                          (val,(back_insert_iterator<jsoncons::binary_stream_sink>)pbVar2);
              }
            }
            goto LAB_0043ad6b;
          }
          binary_stream_sink::push_back(&this->sink_,0xcc);
        }
        binary_stream_sink::push_back(&this->sink_,(uint8_t)val);
      }
      goto LAB_0043ad6b;
    }
LAB_0043ad64:
    lVar8.rem = 0;
    lVar8.quot = val;
  }
  write_timestamp(this,lVar8.quot,lVar8.rem);
LAB_0043ad6b:
  psVar3 = (this->stack_).
           super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar3) {
    psVar1 = &psVar3[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t val, 
            semantic_tag tag, 
            const ser_context&,
            std::error_code&) final
        {
            switch (tag)
            {
                case semantic_tag::epoch_second:
                    write_timestamp(val, 0);
                    break;
                case semantic_tag::epoch_milli:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(val,millis_in_second);
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem*nanos_in_milli;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                case semantic_tag::epoch_nano:
                {
                    if (val != 0)
                    {
                        auto dv = std::div(val,static_cast<int64_t>(nanos_in_second));
                        int64_t seconds = dv.quot;
                        int64_t nanoseconds = dv.rem;
                        if (nanoseconds < 0)
                        {
                            nanoseconds = -nanoseconds; 
                        }
                        write_timestamp(seconds, nanoseconds);
                    }
                    else
                    {
                        write_timestamp(0, 0);
                    }
                    break;
                }
                default:
                {
                    if (val >= 0)
                    {
                        if (val <= 0x7f)
                        {
                            // positive fixnum stores 7-bit positive integer
                            sink_.push_back(static_cast<uint8_t>(val));
                        }
                        else if (val <= (std::numeric_limits<uint8_t>::max)())
                        {
                            // uint 8 stores a 8-bit unsigned integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint8_type);
                            sink_.push_back(static_cast<uint8_t>(val));
                        }
                        else if (val <= (std::numeric_limits<uint16_t>::max)())
                        {
                            // uint 16 stores a 16-bit big-endian unsigned integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint16_type);
                            binary::native_to_big(static_cast<uint16_t>(val),std::back_inserter(sink_));
                        }
                        else if (val <= (std::numeric_limits<uint32_t>::max)())
                        {
                            // uint 32 stores a 32-bit big-endian unsigned integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint32_type);
                            binary::native_to_big(static_cast<uint32_t>(val),std::back_inserter(sink_));
                        }
                        else if (val <= (std::numeric_limits<int64_t>::max)())
                        {
                            // int 64 stores a 64-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::uint64_type);
                            binary::native_to_big(static_cast<uint64_t>(val),std::back_inserter(sink_));
                        }
                    }
                    else
                    {
                        if (val >= -32)
                        {
                            // negative fixnum stores 5-bit negative integer
                            binary::native_to_big(static_cast<int8_t>(val), std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int8_t>::lowest)())
                        {
                            // int 8 stores a 8-bit signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int8_type);
                            binary::native_to_big(static_cast<int8_t>(val),std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int16_t>::lowest)())
                        {
                            // int 16 stores a 16-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int16_type);
                            binary::native_to_big(static_cast<int16_t>(val),std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int32_t>::lowest)())
                        {
                            // int 32 stores a 32-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int32_type);
                            binary::native_to_big(static_cast<int32_t>(val),std::back_inserter(sink_));
                        }
                        else if (val >= (std::numeric_limits<int64_t>::lowest)())
                        {
                            // int 64 stores a 64-bit big-endian signed integer
                            sink_.push_back(jsoncons::msgpack::msgpack_type::int64_type);
                            binary::native_to_big(static_cast<int64_t>(val),std::back_inserter(sink_));
                        }
                    }
                }
                break;
            }
            end_value();
            JSONCONS_VISITOR_RETURN;
        }